

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_rb_seek_read(ma_rb *pRB,size_t offsetInBytes)

{
  int iVar1;
  uint uVar2;
  uint local_88;
  uint local_84;
  ma_uint32 newReadOffsetLoopFlag;
  ma_uint32 newReadOffsetInBytes;
  ma_uint32 writeOffsetLoopFlag;
  ma_uint32 writeOffsetInBytes;
  ma_uint32 writeOffset;
  ma_uint32 readOffsetLoopFlag;
  ma_uint32 readOffsetInBytes;
  ma_uint32 readOffset;
  size_t offsetInBytes_local;
  ma_rb *pRB_local;
  ma_uint32 *local_50;
  ma_uint32 *local_48;
  uint local_3c;
  ma_uint32 *local_38;
  ma_uint32 *local_30;
  uint local_24;
  uint local_18;
  uint local_10;
  
  if ((pRB == (ma_rb *)0x0) || (pRB->subbufferSizeInBytes < offsetInBytes)) {
    pRB_local._4_4_ = -2;
  }
  else {
    readOffsetLoopFlag = pRB->encodedReadOffset;
    local_30 = &writeOffset;
    local_38 = &writeOffsetInBytes;
    _readOffsetInBytes = offsetInBytes;
    offsetInBytes_local = (size_t)pRB;
    local_24 = readOffsetLoopFlag;
    if (local_30 == (ma_uint32 *)0x0) {
      __assert_fail("pOffsetInBytes != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                    ,0xa51b,"void ma_rb__deconstruct_offset(ma_uint32, ma_uint32 *, ma_uint32 *)");
    }
    if (local_38 == (ma_uint32 *)0x0) {
      __assert_fail("pOffsetLoopFlag != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                    ,0xa51c,"void ma_rb__deconstruct_offset(ma_uint32, ma_uint32 *, ma_uint32 *)");
    }
    uVar2 = readOffsetLoopFlag & 0x7fffffff;
    local_88 = readOffsetLoopFlag & 0x80000000;
    writeOffsetLoopFlag = pRB->encodedWriteOffset;
    local_48 = &newReadOffsetInBytes;
    local_50 = &newReadOffsetLoopFlag;
    local_3c = writeOffsetLoopFlag;
    local_18 = readOffsetLoopFlag;
    local_10 = readOffsetLoopFlag;
    if (local_48 == (ma_uint32 *)0x0) {
      __assert_fail("pOffsetInBytes != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                    ,0xa51b,"void ma_rb__deconstruct_offset(ma_uint32, ma_uint32 *, ma_uint32 *)");
    }
    if (local_50 == (ma_uint32 *)0x0) {
      __assert_fail("pOffsetLoopFlag != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                    ,0xa51c,"void ma_rb__deconstruct_offset(ma_uint32, ma_uint32 *, ma_uint32 *)");
    }
    local_84 = writeOffsetLoopFlag & 0x7fffffff;
    iVar1 = (int)offsetInBytes;
    if (local_88 == (writeOffsetLoopFlag & 0x80000000)) {
      if (uVar2 + offsetInBytes <= (ulong)local_84) {
        local_84 = uVar2 + iVar1;
      }
    }
    else if (uVar2 + offsetInBytes < (ulong)pRB->subbufferSizeInBytes) {
      local_84 = uVar2 + iVar1;
    }
    else {
      local_84 = (uVar2 + iVar1) - pRB->subbufferSizeInBytes;
      local_88 = local_88 ^ 0x80000000;
    }
    LOCK();
    pRB->encodedReadOffset = local_88 | local_84;
    UNLOCK();
    pRB_local._4_4_ = 0;
  }
  return pRB_local._4_4_;
}

Assistant:

MA_API ma_result ma_rb_seek_read(ma_rb* pRB, size_t offsetInBytes)
{
    ma_uint32 readOffset;
    ma_uint32 readOffsetInBytes;
    ma_uint32 readOffsetLoopFlag;
    ma_uint32 writeOffset;
    ma_uint32 writeOffsetInBytes;
    ma_uint32 writeOffsetLoopFlag;
    ma_uint32 newReadOffsetInBytes;
    ma_uint32 newReadOffsetLoopFlag;

    if (pRB == NULL || offsetInBytes > pRB->subbufferSizeInBytes) {
        return MA_INVALID_ARGS;
    }

    readOffset = c89atomic_load_32(&pRB->encodedReadOffset);
    ma_rb__deconstruct_offset(readOffset, &readOffsetInBytes, &readOffsetLoopFlag);

    writeOffset = c89atomic_load_32(&pRB->encodedWriteOffset);
    ma_rb__deconstruct_offset(writeOffset, &writeOffsetInBytes, &writeOffsetLoopFlag);

    newReadOffsetLoopFlag = readOffsetLoopFlag;

    /* We cannot go past the write buffer. */
    if (readOffsetLoopFlag == writeOffsetLoopFlag) {
        if ((readOffsetInBytes + offsetInBytes) > writeOffsetInBytes) {
            newReadOffsetInBytes = writeOffsetInBytes;
        } else {
            newReadOffsetInBytes = (ma_uint32)(readOffsetInBytes + offsetInBytes);
        }
    } else {
        /* May end up looping. */
        if ((readOffsetInBytes + offsetInBytes) >= pRB->subbufferSizeInBytes) {
            newReadOffsetInBytes = (ma_uint32)(readOffsetInBytes + offsetInBytes) - pRB->subbufferSizeInBytes;
            newReadOffsetLoopFlag ^= 0x80000000;    /* <-- Looped. */
        } else {
            newReadOffsetInBytes = (ma_uint32)(readOffsetInBytes + offsetInBytes);
        }
    }

    c89atomic_exchange_32(&pRB->encodedReadOffset, ma_rb__construct_offset(newReadOffsetInBytes, newReadOffsetLoopFlag));
    return MA_SUCCESS;
}